

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

bool __thiscall hwtest::pgraph::MthdCelsiusLightEnable::is_valid_val(MthdCelsiusLightEnable *this)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (ulong)(this->super_SingleMthdTest).super_MthdTest.val;
  if (uVar2 < 0x10000) {
    lVar1 = 0x3e;
    for (bVar3 = 0;
        (bVar5 = lVar1 == 0x2e, !bVar5 &&
        (uVar4 = uVar2 << ((byte)lVar1 & 0x3f), !(bool)(bVar3 & 0x3fffffffffffffff < uVar4)));
        bVar3 = bVar3 | uVar4 < 0x4000000000000000) {
      lVar1 = lVar1 + -2;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool is_valid_val() override {
		if (val & ~0xffff)
			return false;
		bool off = false;
		for (int i = 0; i < 8; i++) {
			int mode = extr(val, i * 2, 2);
			if (off && mode != 0)
				return false;
			if (mode == 0)
				off = true;
		}
		return true;
	}